

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# redexpress.cpp
# Opt level: O1

void addExpression_T100(MidiFile *midifile)

{
  int iVar1;
  ostream *poVar2;
  MidiEvent me;
  MidiEvent local_50;
  
  iVar1 = smf::MidiFile::getTrackCount(midifile);
  if (iVar1 == 5) {
    smf::MidiFile::addTrack(midifile);
    iVar1 = getRewindTime(midifile,4);
    smf::MidiEvent::MidiEvent(&local_50);
    local_50.track = 5;
    local_50.tick = iVar1;
    smf::MidiMessage::makeController(&local_50.super_MidiMessage,1,7,0);
    smf::MidiFile::addEvent(midifile,&local_50);
    smf::MidiMessage::makeController(&local_50.super_MidiMessage,2,7,0);
    smf::MidiFile::addEvent(midifile,&local_50);
    addSustainPedalling(midifile,4,5);
    addSoftPedalling(midifile,4,5);
    smf::MidiFile::sortTracksNoteOnsBeforeOffs(midifile);
    smf::MidiEvent::~MidiEvent(&local_50);
    return;
  }
  poVar2 = std::operator<<((ostream *)&std::cerr,
                           "This program expects a five-track MIDI file to process");
  std::endl<char,std::char_traits<char>>(poVar2);
  exit(1);
}

Assistant:

void addExpression_T100(MidiFile& midifile) {
	int tracks = midifile.getTrackCount();
	if (tracks != 5) {
		cerr << "This program expects a five-track MIDI file to process" << endl;
		exit(1);
	}

	// add a new track with some of the expression components (pedal)
	midifile.addTrack();

	int expressiontrack = 5;
	int rewind = getRewindTime(midifile, 4);
	MidiEvent me;
	me.tick = rewind;
	me.track = expressiontrack;

	me.makeController(1, 7, 0);  // mute for any post-rewind holes: bass
	midifile.addEvent(me);
	me.makeController(2, 7, 0);  // mute for any post-rewind holes: treble
	midifile.addEvent(me);

	addSustainPedalling(midifile, 4, expressiontrack);
	addSoftPedalling(midifile, 4, expressiontrack);

	midifile.sortTracks();
}